

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  float *out_g;
  ImVec2 *out_b;
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  undefined1 __src [8];
  ImDrawList *pIVar3;
  undefined4 uVar4;
  uint uVar5;
  ImU32 col_00;
  ImU32 IVar6;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined8 extraout_RAX;
  char *text_end;
  int iVar7;
  long lVar8;
  uint uVar9;
  byte bVar10;
  ImGuiContext *g;
  ulong uVar11;
  char cVar12;
  ImVec2 *pIVar13;
  bool bVar14;
  uint uVar15;
  int iVar16;
  float fVar17;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  ImVec2 IVar18;
  undefined4 extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  ImVec2 p_min;
  ImVec2 pos;
  ImVec2 pos_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  float fVar19;
  float fVar20;
  ImVec2 p_max;
  ImVec2 gradient_p1;
  ImVec2 p_max_00;
  ImVec2 half_sz;
  ImVec2 half_sz_00;
  float fVar27;
  uint uVar28;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  float local_26c;
  float local_268;
  float V;
  uint local_260;
  float local_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  ImVec2 *local_238;
  uint local_230;
  float B;
  float G;
  float R;
  ImDrawList *local_220;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  ImVec2 local_208;
  uint local_1fc;
  ImVec2 triangle_pc;
  ImVec2 triangle_pa;
  ImVec2 local_1d0;
  float local_1c8;
  float fStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  ImVec2 current_off_unrotated;
  float vv;
  float fStack_18c;
  ImVec2 local_188;
  ImVec2 picker_pos;
  char local_178;
  float ww;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  ImVec2 tra;
  float uu;
  float fStack_104;
  float local_100;
  float local_fc;
  undefined1 local_f8 [16];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  size_t local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  float local_98;
  float fStack_94;
  uint uStack_90;
  uint uStack_8c;
  undefined1 local_88 [16];
  ulong local_78;
  ImVec2 trc;
  float backup_initial_col [4];
  ImVec2 uv_white;
  ImVec2 trb;
  undefined1 auVar22 [16];
  
  pIVar2 = GImGui;
  uStack_240 = local_248;
  local_248 = (undefined1  [8])ref_col;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems != false) {
    bVar10 = 0;
    goto LAB_00140a91;
  }
  local_220 = pIVar1->DrawList;
  local_258._0_4_ = CalcItemWidth();
  local_258._4_4_ = extraout_XMM0_Db;
  fStack_250 = (float)extraout_XMM0_Dc;
  fStack_24c = (float)extraout_XMM0_Dd;
  (pIVar2->NextItemData).Flags = 0;
  PushID(label);
  BeginGroup();
  uVar9 = (uint)~flags >> 4 & 0x10 | flags;
  if ((flags & 8U) == 0) {
    ColorPickerOptionsPopup(col,uVar9);
  }
  if ((flags & 0x6000000U) == 0) {
    uVar5 = pIVar2->ColorEditOptions & 0x6000000;
    uVar15 = 0x2000000;
    if (uVar5 != 0) {
      uVar15 = uVar5;
    }
    uVar9 = uVar9 | uVar15;
  }
  if ((uVar9 & 0x18000000) == 0) {
    uVar5 = pIVar2->ColorEditOptions & 0x18000000;
    uVar15 = 0x8000000;
    if (uVar5 != 0) {
      uVar15 = uVar5;
    }
    uVar9 = uVar9 | uVar15;
  }
  if ((uVar9 & 8) == 0) {
    uVar9 = uVar9 | pIVar2->ColorEditOptions & 0x10000U;
  }
  local_1fc = uVar9 & 0x10002;
  bVar14 = local_1fc == 0x10000;
  IVar18 = (pIVar1->DC).CursorPos;
  local_238 = (ImVec2 *)col;
  picker_pos = IVar18;
  local_1c8 = GetFrameHeight();
  pIVar13 = local_238;
  fVar17 = (pIVar2->Style).ItemInnerSpacing.x;
  fVar29 = (float)local_258._0_4_ - (local_1c8 + fVar17) * (float)(byte)(bVar14 + 1);
  uVar15 = -(uint)(fVar29 <= local_1c8);
  fVar27 = (float)(local_258._4_4_ & (uint)extraout_XMM0_Db_00);
  uVar5 = (uint)fStack_250 & extraout_XMM0_Dc_00;
  uVar28 = (uint)fStack_24c & extraout_XMM0_Dd_00;
  fVar19 = (float)(uVar15 & (uint)local_1c8 | ~uVar15 & (uint)fVar29);
  local_c0 = (ulong)((uVar9 & 2) == 0) * 4 + 0xc;
  fStack_1c4 = extraout_XMM0_Db_00;
  uStack_1c0 = extraout_XMM0_Dc_00;
  uStack_1bc = extraout_XMM0_Dd_00;
  memcpy(backup_initial_col,local_238,local_c0);
  local_25c = fVar19 * 0.08;
  local_b8 = ZEXT416((uint)(fVar19 * 0.5));
  fVar20 = fVar19 * 0.5 - local_25c;
  _local_d8 = ZEXT416((uint)fVar20);
  fVar29 = IVar18.x;
  local_88._0_4_ = fVar29;
  local_98 = fVar19 + fVar29;
  _local_258 = ZEXT416((uint)(fVar17 + local_98));
  local_208.x = (local_1c8 + fVar19) * 0.5 + fVar29;
  fVar34 = IVar18.y;
  local_208.y = fVar19 * 0.5 + fVar34;
  triangle_pa.x = fVar20 - (float)(int)(fVar19 * 0.027);
  triangle_pa.y = 0.0;
  local_1d0.x = triangle_pa.x * -0.5;
  local_1d0.y = triangle_pa.x * -0.866025;
  local_128._4_4_ = local_208.y;
  local_128._0_4_ = local_208.x;
  fStack_120 = fStack_1c4 * 0.0 + 0.0;
  fStack_11c = fVar27 * 0.0 + 0.0;
  triangle_pc.y = triangle_pa.x * 0.866025;
  local_26c = pIVar13->x;
  local_268 = pIVar13->y;
  V = pIVar13[1].x;
  B = V;
  G = local_268;
  R = local_26c;
  triangle_pc.x = local_1d0.x;
  fStack_94 = fVar27;
  uStack_90 = uVar5;
  uStack_8c = uVar28;
  if ((uVar9 >> 0x1b & 1) == 0) {
    if ((uVar9 >> 0x1c & 1) != 0) {
      ColorConvertHSVtoRGB(local_26c,local_268,V,&R,&G,&B);
    }
  }
  else {
    ColorConvertRGBtoHSV(local_26c,local_268,V,&local_26c,&local_268,&V);
    iVar7 = bcmp(pIVar2->ColorEditLastColor,pIVar13,0xc);
    if (iVar7 == 0) {
      if ((local_268 == 0.0) && (!NAN(local_268))) {
        local_26c = pIVar2->ColorEditLastHue;
      }
      if ((V == 0.0) && (!NAN(V))) {
        local_268 = pIVar2->ColorEditLastSat;
      }
    }
  }
  local_218._4_4_ = fStack_1c4;
  local_218._0_4_ = local_1c8 + (float)local_258._0_4_;
  fStack_210 = (float)uStack_1c0;
  fStack_20c = (float)uStack_1bc;
  PushItemFlag(8,true);
  local_138 = fVar34;
  fStack_134 = fVar34;
  fStack_130 = fVar34;
  fStack_12c = fVar34;
  local_e8 = fVar34;
  fStack_e4 = fVar34;
  fStack_e0 = fVar34;
  fStack_dc = fVar34;
  if ((uVar9 >> 0x1a & 1) == 0) {
    if ((uVar9 >> 0x19 & 1) == 0) {
      uVar15 = 0;
      local_260 = 0;
      uVar11 = 0;
    }
    else {
      current_off_unrotated.y = fVar19;
      current_off_unrotated.x = fVar19;
      uVar15 = 0;
      InvisibleButton("sv",&current_off_unrotated,0);
      bVar14 = IsItemActive();
      if (bVar14) {
        auVar21._0_4_ = fVar19 + -1.0;
        IVar18 = (pIVar2->IO).MousePos;
        auVar31._0_4_ = IVar18.x - fVar29;
        auVar31._4_4_ = IVar18.y - fVar34;
        auVar31._8_8_ = 0;
        auVar21._4_4_ = auVar21._0_4_;
        auVar21._8_4_ = auVar21._0_4_;
        auVar21._12_4_ = auVar21._0_4_;
        auVar31 = divps(auVar31,auVar21);
        fVar29 = auVar31._0_4_;
        fVar20 = auVar31._4_4_;
        iVar7 = -(uint)(1.0 < fVar29);
        iVar16 = -(uint)(1.0 < fVar20);
        auVar23._4_4_ = iVar16;
        auVar23._0_4_ = iVar7;
        auVar23._8_4_ = iVar16;
        auVar23._12_4_ = iVar16;
        auVar22._8_8_ = auVar23._8_8_;
        auVar22._4_4_ = iVar7;
        auVar22._0_4_ = iVar7;
        uVar15 = movmskpd((int)CONCAT71(extraout_var,bVar14),auVar22);
        local_268 = 1.0;
        if ((uVar15 & 1) == 0) {
          local_268 = fVar29;
        }
        local_268 = (float)(~-(uint)(fVar29 < 0.0) & (uint)local_268);
        fVar29 = 0.0;
        if ((uVar15 & 2) == 0) {
          fVar29 = 1.0 - fVar20;
        }
        V = (float)(-(uint)(fVar20 < 0.0) & 0x3f800000 | ~-(uint)(fVar20 < 0.0) & (uint)fVar29);
        uVar15 = (uint)CONCAT71((uint7)(uint3)(uVar15 >> 8),1);
      }
      if ((uVar9 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      current_off_unrotated.y = local_138;
      current_off_unrotated.x = (float)local_258._0_4_;
      SetCursorScreenPos(&current_off_unrotated);
      current_off_unrotated.y = fVar19;
      current_off_unrotated.x = local_1c8;
      local_260 = 0;
      InvisibleButton("hue",&current_off_unrotated,0);
      bVar14 = IsItemActive();
      if (bVar14) {
        fVar29 = ((pIVar2->IO).MousePos.y - local_e8) / (fVar19 + -1.0);
        local_26c = 1.0;
        if (fVar29 <= 1.0) {
          local_26c = fVar29;
        }
        local_26c = (float)(~-(uint)(fVar29 < 0.0) & (uint)local_26c);
        local_260 = (uint)CONCAT71(extraout_var_00,1);
        uVar11 = CONCAT71((int7)((ulong)pIVar2 >> 8),1);
      }
      else {
        uVar11 = (ulong)uVar15;
      }
    }
  }
  else {
    current_off_unrotated.y = fVar19;
    current_off_unrotated.x = (pIVar2->Style).ItemInnerSpacing.x + fVar19 + local_1c8;
    uVar15 = 0;
    InvisibleButton("hsv",&current_off_unrotated,0);
    bVar14 = IsItemActive();
    local_260 = 0;
    uVar11 = 0;
    if (bVar14) {
      fVar33 = (pIVar2->IO).MouseClickedPos[0].x - (float)local_128._0_4_;
      fVar35 = (pIVar2->IO).MouseClickedPos[0].y - (float)local_128._4_4_;
      fVar20 = (pIVar2->IO).MousePos.x - (float)local_128._0_4_;
      local_a8 = ZEXT416((uint)fVar20);
      fVar29 = (pIVar2->IO).MousePos.y - (float)local_128._4_4_;
      local_f8 = ZEXT416((uint)fVar29);
      fVar34 = fVar33 * fVar33 + fVar35 * fVar35;
      _local_128 = ZEXT416((uint)fVar33);
      if ((fVar34 < ((float)local_d8._0_4_ + -1.0) * ((float)local_d8._0_4_ + -1.0)) ||
         (((float)local_b8._0_4_ + 1.0) * ((float)local_b8._0_4_ + 1.0) < fVar34)) {
        local_260 = 0;
      }
      else {
        fVar29 = atan2f(fVar29,fVar20);
        fVar29 = (fVar29 / 3.1415927) * 0.5;
        local_26c = (float)(~-(uint)(fVar29 < 0.0) & (uint)fVar29 |
                           (uint)(fVar29 + 1.0) & -(uint)(fVar29 < 0.0));
        local_260 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      fVar29 = cosf(local_26c * -2.0 * 3.1415927);
      fVar20 = sinf(local_26c * -2.0 * 3.1415927);
      uVar4 = local_128._0_4_;
      local_128._4_4_ = extraout_XMM0_Db_01;
      local_128._0_4_ = fVar20;
      fStack_120 = (float)extraout_XMM0_Dc_01;
      fStack_11c = (float)extraout_XMM0_Dd_01;
      current_off_unrotated.x = fVar29 * (float)uVar4 + -fVar35 * fVar20;
      current_off_unrotated.y = fVar20 * (float)uVar4 + fVar29 * fVar35;
      bVar14 = ImTriangleContainsPoint(&triangle_pa,&local_1d0,&triangle_pc,&current_off_unrotated);
      if (bVar14) {
        current_off_unrotated.x =
             fVar29 * (float)local_a8._0_4_ + -(float)local_f8._0_4_ * (float)local_128._0_4_;
        current_off_unrotated.y =
             (float)local_128._0_4_ * (float)local_a8._0_4_ + fVar29 * (float)local_f8._0_4_;
        bVar14 = ImTriangleContainsPoint
                           (&triangle_pa,&local_1d0,&triangle_pc,&current_off_unrotated);
        if (!bVar14) {
          current_off_unrotated =
               ImTriangleClosestPoint(&triangle_pa,&local_1d0,&triangle_pc,&current_off_unrotated);
        }
        ImTriangleBarycentricCoords
                  (&triangle_pa,&local_1d0,&triangle_pc,&current_off_unrotated,&uu,&vv,&ww);
        fVar20 = 1.0 - vv;
        fVar29 = 1.0;
        if (fVar20 <= 1.0) {
          fVar29 = fVar20;
        }
        V = (float)(-(uint)(fVar20 < 0.0001) & 0x38d1b717 | ~-(uint)(fVar20 < 0.0001) & (uint)fVar29
                   );
        fVar20 = uu / V;
        fVar29 = 1.0;
        if (fVar20 <= 1.0) {
          fVar29 = fVar20;
        }
        local_268 = (float)(-(uint)(fVar20 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar20 < 0.0001) & (uint)fVar29);
        uVar15 = 1;
        uVar11 = 1;
      }
      else {
        uVar15 = 0;
        uVar11 = (ulong)local_260;
      }
    }
    if ((uVar9 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  fVar17 = fVar17 + (float)local_218._0_4_;
  if (local_1fc == 0x10000) {
    current_off_unrotated.y = local_138;
    current_off_unrotated.x = fVar17;
    SetCursorScreenPos(&current_off_unrotated);
    current_off_unrotated.y = fVar19;
    current_off_unrotated.x = local_1c8;
    InvisibleButton("alpha",&current_off_unrotated,0);
    bVar14 = IsItemActive();
    if (bVar14) {
      fVar20 = ((pIVar2->IO).MousePos.y - local_e8) / (fVar19 + -1.0);
      fVar29 = 1.0;
      if (fVar20 <= 1.0) {
        fVar29 = fVar20;
      }
      pIVar13[1].y = (float)(-(uint)(fVar20 < 0.0) & 0x3f800000 |
                            ~-(uint)(fVar20 < 0.0) & (uint)(1.0 - fVar29));
      uVar11 = CONCAT71((int7)(uVar11 >> 8),1);
    }
  }
  PopItemFlag();
  if ((uVar9 >> 8 & 1) == 0) {
    SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  if ((-1 < (char)uVar9) && (text_end = FindRenderedTextEnd(label,(char *)0x0), text_end != label))
  {
    if ((uVar9 >> 8 & 1) != 0) {
      SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
    }
    TextEx(label,text_end,0);
  }
  if ((uVar9 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    current_off_unrotated = *pIVar13;
    __src = local_248;
    if ((char)uVar9 < '\0') {
      Text("Current");
    }
    IVar18.x = local_1c8 * 3.0;
    IVar18.y = local_1c8 * 2.0;
    uStack_240._0_4_ = local_1c8 * 0.0;
    local_248._0_4_ = IVar18.x;
    local_248._4_4_ = IVar18.y;
    uStack_240._4_4_ = local_1c8 * 0.0;
    ColorButton("##current",(ImVec4 *)&current_off_unrotated,uVar9 & 0x180e0040,IVar18);
    if (__src != (undefined1  [8])0x0) {
      Text("Original");
      _uu = *(undefined8 *)__src;
      local_100 = *(float *)((long)__src + 8);
      if ((uVar9 & 2) == 0) {
        local_fc = *(float *)((long)__src + 0xc);
      }
      else {
        local_fc = 1.0;
      }
      bVar14 = ColorButton("##original",(ImVec4 *)&uu,uVar9 & 0x180e0040,(ImVec2)local_248);
      if (bVar14) {
        memcpy(pIVar13,(void *)__src,local_c0);
        uVar11 = CONCAT71((int7)(uVar11 >> 8),1);
      }
    }
    PopItemFlag();
    EndGroup();
  }
  fVar29 = local_1c8 * 0.2;
  fVar20 = 0.0;
  fVar34 = 0.0;
  fVar33 = 0.0;
  out_g = &pIVar13->y;
  out_b = pIVar13 + 1;
  local_178 = (char)uVar15;
  if (((char)local_260 != '\0') || (local_178 != '\0')) {
    if ((uVar9 >> 0x1b & 1) == 0) {
      if ((uVar9 >> 0x1c & 1) != 0) {
        pIVar13->x = local_26c;
        pIVar13->y = local_268;
        pIVar13[1].x = V;
      }
    }
    else {
      _local_248 = ZEXT416((uint)fVar29);
      ColorConvertHSVtoRGB
                ((float)(~-(uint)(1.0 <= local_26c) & (uint)local_26c |
                        (uint)(local_26c + -1e-05) & -(uint)(1.0 <= local_26c)),
                 (float)(~-(uint)(0.0 < local_268) & 0x3727c5ac |
                        (uint)local_268 & -(uint)(0.0 < local_268)),
                 (float)(~-(uint)(0.0 < V) & 0x358637bd | (uint)V & -(uint)(0.0 < V)),&pIVar13->x,
                 out_g,&out_b->x);
      pIVar2->ColorEditLastHue = local_26c;
      pIVar2->ColorEditLastSat = local_268;
      fVar29 = pIVar13->y;
      pIVar2->ColorEditLastColor[0] = pIVar13->x;
      pIVar2->ColorEditLastColor[1] = fVar29;
      pIVar2->ColorEditLastColor[2] = pIVar13[1].x;
      fVar29 = (float)local_248._0_4_;
      fVar20 = (float)local_248._4_4_;
      fVar34 = (float)uStack_240;
      fVar33 = uStack_240._4_4_;
    }
  }
  iVar7 = (int)fVar29;
  if ((uVar9 & 0x20) == 0) {
    local_248._4_4_ = (int)fVar20;
    local_248._0_4_ = (int)fVar29;
    uStack_240._0_4_ = (float)(int)fVar34;
    uStack_240._4_4_ = (float)(int)fVar33;
    fVar29 = fVar17;
    if (local_1fc != 0x10000) {
      fVar29 = (float)local_258._0_4_;
    }
    PushItemWidth((fVar29 + local_1c8) - (float)local_88._0_4_);
    uVar15 = uVar9 & 0x198e001a;
    cVar12 = '\x01';
    if (((uVar9 >> 0x14 & 1) != 0 || (uVar9 & 0x600000) == 0) &&
       (bVar14 = ColorEdit4("##rgb",&local_238->x,uVar15 | 0x100004), bVar14)) {
      uVar11 = CONCAT71((int7)(uVar11 >> 8),1);
      if (pIVar2->ActiveId == 0) {
        cVar12 = '\x01';
      }
      else {
        cVar12 = pIVar2->ActiveIdAllowOverlap;
      }
    }
    if ((uVar9 >> 0x15 & 1) != 0 || (uVar9 & 0x500000) == 0) {
      bVar14 = ColorEdit4("##hsv",&local_238->x,uVar15 | 0x200004);
      uVar11 = CONCAT71((int7)(uVar11 >> 8),(byte)uVar11 | bVar14);
    }
    if ((uVar9 >> 0x16 & 1) != 0 || (uVar9 & 0x300000) == 0) {
      bVar14 = ColorEdit4("##hex",&local_238->x,uVar15 | 0x400004);
      uVar11 = CONCAT71((int7)(uVar11 >> 8),(byte)uVar11 | bVar14);
    }
    PopItemWidth();
    pIVar13 = local_238;
    if ((uVar9 >> 0x1b & 1) != 0 && cVar12 == '\0') {
      ColorConvertRGBtoHSV
                (local_238->x,local_238->y,local_238[1].x,&current_off_unrotated.x,&uu,&vv);
      uVar11 = uVar11 & 0xffffffff;
      if ((current_off_unrotated.x <= 0.0) && (0.0 < local_26c)) {
        if (0.0 < vv) {
LAB_0013fe39:
          if (0.0 < uu) goto LAB_0013fe5f;
          fVar29 = local_268 * 0.5;
        }
        else {
          if ((V == vv) && (!NAN(V) && !NAN(vv))) goto LAB_0013fe39;
          vv = V * 0.5;
          fVar29 = local_268;
        }
        ColorConvertHSVtoRGB(local_26c,fVar29,vv,&pIVar13->x,out_g,&out_b->x);
      }
    }
LAB_0013fe5f:
    iVar7 = local_248._0_4_;
  }
  fVar29 = (float)iVar7;
  if ((char)uVar11 != '\0') {
    if ((uVar9 >> 0x1b & 1) == 0) {
      if ((uVar9 >> 0x1c & 1) != 0) {
        local_26c = pIVar13->x;
        local_268 = pIVar13->y;
        V = pIVar13[1].x;
        ColorConvertHSVtoRGB(local_26c,local_268,V,&R,&G,&B);
      }
    }
    else {
      R = pIVar13->x;
      G = pIVar13->y;
      B = pIVar13[1].x;
      ColorConvertRGBtoHSV(R,G,B,&local_26c,&local_268,&V);
      iVar7 = bcmp(pIVar2->ColorEditLastColor,pIVar13,0xc);
      if (iVar7 == 0) {
        if ((local_268 == 0.0) && (!NAN(local_268))) {
          local_26c = pIVar2->ColorEditLastHue;
        }
        if ((V == 0.0) && (!NAN(V))) {
          local_268 = pIVar2->ColorEditLastSat;
        }
      }
    }
  }
  local_fc = (pIVar2->Style).Alpha;
  fVar20 = 1.0;
  if (local_fc <= 1.0) {
    fVar20 = local_fc;
  }
  iVar7 = (int)((float)(~-(uint)(local_fc < 0.0) & (uint)fVar20) * 255.0 + 0.5);
  uu = 1.0;
  fStack_104 = 1.0;
  local_100 = 1.0;
  uVar15 = iVar7 * 0x1000000;
  local_248 = (undefined1  [8])(CONCAT44(iVar7 << 0x18,iVar7 << 0x18) | 0xffff000000ff);
  uStack_240._0_4_ = (float)(iVar7 << 0x18 | 0xff00);
  uStack_240._4_4_ = (float)(iVar7 << 0x18 | 0xffff00);
  local_138 = (float)(uVar15 + 0xffffff);
  current_off_unrotated = (ImVec2)(CONCAT44(iVar7 << 0x18,iVar7 << 0x18) | 0xffff000000ff);
  local_f8._0_4_ = uVar15 + 0x808080;
  ColorConvertHSVtoRGB(local_26c,1.0,1.0,&uu,&fStack_104,&local_100);
  col_00 = ColorConvertFloat4ToU32((ImVec4 *)&uu);
  fStack_18c = G;
  vv = R;
  local_188.y = (pIVar2->Style).Alpha;
  local_188.x = B;
  IVar6 = ColorConvertFloat4ToU32((ImVec4 *)&vv);
  pIVar3 = local_220;
  ww = 0.0;
  fStack_13c = 0.0;
  local_a8._0_4_ = IVar6;
  fVar20 = (float)local_248._0_4_;
  if ((uVar9 >> 0x1a & 1) == 0) {
    if ((uVar9 >> 0x19 & 1) != 0) {
      fStack_18c = local_e8 + fVar19;
      vv = local_98;
      local_230 = (uint)uVar11;
      ImDrawList::AddRectFilledMultiColor
                (local_220,&picker_pos,(ImVec2 *)&vv,(ImU32)local_138,col_00,col_00,(ImU32)local_138
                );
      local_248._4_4_ = fVar19;
      local_248._0_4_ = fVar19;
      uStack_240._0_4_ = fVar19;
      uStack_240._4_4_ = fVar19;
      vv = picker_pos.x + fVar19;
      fStack_18c = picker_pos.y + fVar19;
      ImDrawList::AddRectFilledMultiColor(pIVar3,&picker_pos,(ImVec2 *)&vv,0,0,uVar15,uVar15);
      p_max.x = (float)local_248._0_4_ + picker_pos.x;
      p_max.y = (float)local_248._4_4_ + picker_pos.y;
      RenderFrameBorder(picker_pos,p_max,0.0);
      auVar30._4_4_ = 1.0 - V;
      auVar30._0_4_ = local_268;
      auVar30._8_8_ = 0;
      auVar31 = minps(_DAT_00155e50,auVar30);
      fVar34 = picker_pos.x;
      fVar33 = picker_pos.y;
      auVar24._0_4_ =
           (float)(int)((float)(-(uint)(0.0 <= local_268) & auVar31._0_4_) * (float)local_248._0_4_
                        + fVar34 + 0.5);
      auVar24._4_4_ =
           (float)(int)((float)(-(uint)(0.0 <= 1.0 - V) & auVar31._4_4_) * (float)local_248._4_4_ +
                        fVar33 + 0.5);
      auVar24._8_4_ = (float)(int)(auVar31._8_4_ * (float)uStack_240 + 0.0 + 0.0);
      auVar24._12_4_ = (float)(int)(auVar31._12_4_ * uStack_240._4_4_ + 0.0 + 0.0);
      auVar32._0_4_ = (float)local_248._0_4_ + fVar34 + -2.0;
      auVar32._4_4_ = (float)local_248._4_4_ + fVar33 + -2.0;
      auVar32._8_4_ = (float)uStack_240 + 0.0 + 0.0;
      auVar32._12_4_ = uStack_240._4_4_ + 0.0 + 0.0;
      auVar31 = minps(auVar32,auVar24);
      uVar9 = -(uint)(auVar24._0_4_ < fVar34 + 2.0);
      uVar15 = -(uint)(auVar24._4_4_ < fVar33 + 2.0);
      fStack_13c = (float)(~uVar15 & auVar31._4_4_ | (uint)(fVar33 + 2.0) & uVar15);
      ww = (float)(~uVar9 & auVar31._0_4_ | (uint)(fVar34 + 2.0) & uVar9);
      local_248._4_4_ = fVar27;
      local_248._0_4_ = fVar19 / 6.0;
      uStack_240._0_4_ = (float)uVar5;
      uStack_240._4_4_ = (float)uVar28;
      lVar8 = 0;
      while( true ) {
        if (lVar8 == 6) break;
        fStack_18c = (float)(int)lVar8 * (float)local_248._0_4_ + picker_pos.y;
        vv = (float)local_258._0_4_;
        tra.y = (float)(int)(lVar8 + 1) * (float)local_248._0_4_ + picker_pos.y;
        tra.x = (float)local_218._0_4_;
        fVar27 = (&current_off_unrotated.y)[lVar8];
        ImDrawList::AddRectFilledMultiColor
                  (local_220,(ImVec2 *)&vv,&tra,(ImU32)fVar20,(ImU32)fVar20,(ImU32)fVar27,
                   (ImU32)fVar27);
        lVar8 = lVar8 + 1;
        fVar20 = fVar27;
      }
      _local_248 = ZEXT416((uint)(float)(int)(local_26c * fVar19 + picker_pos.y + 0.5));
      p_min.y = picker_pos.y;
      p_min.x = (float)local_258._0_4_;
      p_max_00.y = fVar19 + picker_pos.y;
      p_max_00.x = (float)local_218._0_4_;
      RenderFrameBorder(p_min,p_max_00,0.0);
      pos.x = (float)local_258._0_4_ + -1.0;
      pos.y = (float)local_248._0_4_;
      half_sz.x = fVar29 + 1.0;
      half_sz.y = fVar29;
      RenderArrowsForVerticalBar(local_220,pos,half_sz,local_1c8 + 2.0,(pIVar2->Style).Alpha);
      uVar11 = (ulong)local_230;
    }
  }
  else {
    local_88 = ZEXT416((uint)(0.5 / (float)local_b8._0_4_));
    local_98 = 5.60519e-45;
    if (4 < (int)(float)local_b8._0_4_ / 0xc) {
      local_98 = (float)((int)(float)local_b8._0_4_ / 0xc);
    }
    local_128._4_4_ = 0x80000000;
    local_128._0_4_ = -(0.5 / (float)local_b8._0_4_);
    fStack_120 = -0.0;
    fStack_11c = -0.0;
    local_b8._0_4_ = (float)local_b8._0_4_ + (float)local_d8._0_4_;
    local_e8 = (float)local_b8._0_4_ * 0.5;
    local_d8._4_4_ = local_d8._0_4_;
    fStack_d0 = (float)local_d8._0_4_;
    fStack_cc = (float)local_d8._0_4_;
    local_230 = (uint)uVar11;
    local_78 = (ulong)uVar15;
    for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
      fVar27 = (float)(int)lVar8 / 6.0;
      fVar34 = (fVar27 + fVar27) * 3.1415927 + (float)local_128._0_4_;
      fVar27 = ((float)(int)lVar8 + 1.0) / 6.0;
      fVar27 = (fVar27 + fVar27) * 3.1415927 + (float)local_88._0_4_;
      local_248._0_4_ = fVar27;
      iVar7 = (pIVar3->VtxBuffer).Size;
      ImDrawList::PathArcTo(pIVar3,&local_208,local_e8,fVar34,fVar27,(int)local_98);
      ImDrawList::PathStroke(pIVar3,(ImU32)local_138,false,local_25c);
      iVar16 = (pIVar3->VtxBuffer).Size;
      _local_218 = ZEXT416((uint)local_208.x);
      local_258._0_4_ = cosf(fVar34);
      local_258._4_4_ = extraout_XMM0_Db_02;
      fStack_250 = (float)extraout_XMM0_Dc_02;
      fStack_24c = (float)extraout_XMM0_Dd_02;
      auVar25._4_4_ = local_208.y;
      auVar25._0_4_ = local_218._0_4_;
      auVar25._8_4_ = local_218._4_4_;
      auVar25._12_4_ = 0;
      _local_218 = auVar25;
      fVar27 = sinf(fVar34);
      fVar34 = (float)local_258._4_4_ * fStack_d0;
      local_258._4_4_ = fVar27 * (float)local_d8._4_4_ + (float)local_218._4_4_;
      local_258._0_4_ = (float)local_258._0_4_ * (float)local_d8._0_4_ + (float)local_218._0_4_;
      fStack_250 = fVar34 + fStack_210;
      fStack_24c = extraout_XMM0_Db_03 * fStack_cc + fStack_20c;
      _local_218 = ZEXT416((uint)local_208.x);
      fVar27 = cosf((float)local_248._0_4_);
      auVar26._4_4_ = local_208.y;
      auVar26._0_4_ = local_218._0_4_;
      auVar26._8_4_ = local_218._4_4_;
      auVar26._12_4_ = 0;
      _local_218 = auVar26;
      fVar34 = sinf((float)local_248._0_4_);
      gradient_p1.x = fVar27 * (float)local_d8._0_4_ + (float)local_218._0_4_;
      gradient_p1.y = fVar34 * (float)local_d8._4_4_ + (float)local_218._4_4_;
      fVar27 = (&current_off_unrotated.y)[lVar8];
      ShadeVertsLinearColorGradientKeepAlpha
                (pIVar3,iVar7,iVar16,(ImVec2)local_258,gradient_p1,(ImU32)fVar20,(ImU32)fVar27);
      fVar20 = fVar27;
    }
    local_258._0_4_ = cosf((local_26c + local_26c) * 3.1415927);
    local_258._4_4_ = extraout_XMM0_Db_04;
    fStack_250 = (float)extraout_XMM0_Dc_03;
    fStack_24c = (float)extraout_XMM0_Dd_03;
    local_218._0_4_ = sinf((local_26c + local_26c) * 3.1415927);
    pIVar3 = local_220;
    local_218._4_4_ = extraout_XMM0_Db_05;
    fStack_210 = (float)extraout_XMM0_Dc_04;
    fStack_20c = (float)extraout_XMM0_Dd_04;
    vv = (float)local_258._0_4_ * (float)local_b8._0_4_ * 0.5 + local_208.x;
    fStack_18c = (float)local_218._0_4_ * (float)local_b8._0_4_ * 0.5 + local_208.y;
    if ((char)local_260 == '\0') {
      fVar20 = 0.55;
    }
    else {
      fVar20 = 0.65;
    }
    uVar11 = (ulong)local_230;
    local_25c = local_25c * fVar20;
    iVar7 = 0x20;
    if ((int)(local_25c / 1.4) < 0x20) {
      iVar7 = (int)(local_25c / 1.4);
    }
    iVar16 = 9;
    if (9 < iVar7) {
      iVar16 = iVar7;
    }
    ImDrawList::AddCircleFilled(local_220,(ImVec2 *)&vv,local_25c,col_00,iVar16);
    ImDrawList::AddCircle(pIVar3,(ImVec2 *)&vv,local_25c + 1.0,local_f8._0_4_,iVar16,1.0);
    ImDrawList::AddCircle(pIVar3,(ImVec2 *)&vv,local_25c,(ImU32)local_138,iVar16,1.0);
    tra.x = triangle_pa.x * (float)local_258._0_4_ + -triangle_pa.y * (float)local_218._0_4_ +
            local_208.x;
    tra.y = triangle_pa.x * (float)local_218._0_4_ + triangle_pa.y * (float)local_258._0_4_ +
            local_208.y;
    trb.x = local_1d0.x * (float)local_258._0_4_ + -local_1d0.y * (float)local_218._0_4_ +
            local_208.x;
    trb.y = local_1d0.x * (float)local_218._0_4_ + local_1d0.y * (float)local_258._0_4_ +
            local_208.y;
    trc.x = triangle_pc.x * (float)local_258._0_4_ + -triangle_pc.y * (float)local_218._0_4_ +
            local_208.x;
    trc.y = triangle_pc.x * (float)local_218._0_4_ + triangle_pc.y * (float)local_258._0_4_ +
            local_208.y;
    uv_white = GetFontTexUvWhitePixel();
    ImDrawList::PrimReserve(pIVar3,6,6);
    ImDrawList::PrimVtx(pIVar3,&tra,&uv_white,col_00);
    ImDrawList::PrimVtx(pIVar3,&trb,&uv_white,col_00);
    ImDrawList::PrimVtx(pIVar3,&trc,&uv_white,(ImU32)local_138);
    ImDrawList::PrimVtx(pIVar3,&tra,&uv_white,0);
    ImDrawList::PrimVtx(pIVar3,&trb,&uv_white,(ImU32)local_78);
    ImDrawList::PrimVtx(pIVar3,&trc,&uv_white,0);
    ImDrawList::AddTriangle(pIVar3,&tra,&trb,&trc,local_f8._0_4_,1.5);
    fVar20 = 1.0;
    if (local_268 <= 1.0) {
      fVar20 = local_268;
    }
    fVar20 = (float)(~-(uint)(local_268 < 0.0) & (uint)fVar20);
    fVar34 = 1.0 - V;
    fVar27 = 1.0;
    if (fVar34 <= 1.0) {
      fVar27 = fVar34;
    }
    fVar27 = (float)(~-(uint)(fVar34 < 0.0) & (uint)fVar27);
    fVar34 = fVar20 * (tra.x - trc.x) + trc.x;
    fVar20 = fVar20 * (tra.y - trc.y) + trc.y;
    ww = fVar27 * (trb.x - fVar34) + fVar34;
    fStack_13c = fVar27 * (trb.y - fVar20) + fVar20;
  }
  pIVar3 = local_220;
  pIVar13 = local_238;
  uVar4 = local_a8._0_4_;
  if (local_178 == '\0') {
    fVar20 = 6.0;
  }
  else {
    fVar20 = 10.0;
  }
  local_258._0_4_ = fVar20;
  ImDrawList::AddCircleFilled(local_220,(ImVec2 *)&ww,fVar20,local_a8._0_4_,0xc);
  ImDrawList::AddCircle(pIVar3,(ImVec2 *)&ww,(float)local_258._0_4_ + 1.0,local_f8._0_4_,0xc,1.0);
  ImDrawList::AddCircle(pIVar3,(ImVec2 *)&ww,(float)local_258._0_4_,(ImU32)local_138,0xc,1.0);
  if (local_1fc == 0x10000) {
    fVar20 = pIVar13[1].y;
    _local_218 = ZEXT416((uint)fVar20);
    fVar27 = 1.0;
    if (fVar20 <= 1.0) {
      fVar27 = fVar20;
    }
    _local_258 = ZEXT416((uint)(1.0 - fVar27));
    fStack_18c = picker_pos.y;
    vv = fVar17;
    local_188.x = fVar17 + local_1c8;
    local_188.y = picker_pos.y + fVar19;
    RenderColorRectWithAlphaCheckerboard
              (pIVar3,_vv,local_188,0,(local_188.x - fVar17) * 0.5,(ImVec2)0x0,0.0,-1);
    ImDrawList::AddRectFilledMultiColor
              (pIVar3,(ImVec2 *)&vv,&local_188,uVar4,uVar4,uVar4 & 0xffffff,uVar4 & 0xffffff);
    pIVar13 = local_238;
    local_258._4_4_ = (float)(int)(float)(~local_218._4_4_ & local_258._4_4_);
    local_258._0_4_ =
         (float)(int)((float)(-(uint)((float)local_218._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_218._0_4_ < 0.0) & local_258._0_4_) * fVar19 +
                      picker_pos.y + 0.5);
    fStack_250 = (float)(int)(float)(~(uint)fStack_210 & (uint)fStack_250);
    fStack_24c = (float)(int)(float)(~(uint)fStack_20c & (uint)fStack_24c);
    RenderFrameBorder(_vv,local_188,0.0);
    pos_00.x = fVar17 + -1.0;
    pos_00.y = (float)local_258._0_4_;
    half_sz_00.x = fVar29 + 1.0;
    half_sz_00.y = fVar29;
    RenderArrowsForVerticalBar(pIVar3,pos_00,half_sz_00,local_1c8 + 2.0,(pIVar2->Style).Alpha);
  }
  EndGroup();
  if ((char)uVar11 != '\0') {
    iVar7 = bcmp(backup_initial_col,pIVar13,local_c0);
    uVar11 = uVar11 & 0xff;
    if (iVar7 == 0) {
      uVar11 = 0;
    }
  }
  bVar10 = (byte)uVar11;
  if ((uVar11 & 1) != 0) {
    MarkItemEdited((pIVar1->DC).LastItemId);
  }
  PopID();
LAB_00140a91:
  return (bool)(bVar10 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImDrawList* draw_list = window->DrawList;
    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    const float width = CalcItemWidth();
    g.NextItemData.ClearFlags();

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    if (!(flags & ImGuiColorEditFlags__InputMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__InputMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__InputMask;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask));  // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, width - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = IM_FLOOR(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size * 0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H = col[0], S = col[1], V = col[2];
    float R = col[0], G = col[1], B = col[2];
    if (flags & ImGuiColorEditFlags_InputRGB)
    {
        // Hue is lost when converting from greyscale rgb (saturation=0). Restore it.
        ColorConvertRGBtoHSV(R, G, B, H, S, V);
        if (memcmp(g.ColorEditLastColor, col, sizeof(float) * 3) == 0)
        {
            if (S == 0)
                H = g.ColorEditLastHue;
            if (V == 0)
                S = g.ColorEditLastSat;
        }
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        ColorConvertHSVtoRGB(H, S, V, R, G, B);
    }

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner - 1) * (wheel_r_inner - 1) && initial_dist2 <= (wheel_r_outer + 1) * (wheel_r_outer + 1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI * 0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size - 1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");

        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf | ImGuiColorEditFlags_NoTooltip;
        ColorButton("##current", col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10 * 1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);
            g.ColorEditLastHue = H;
            g.ColorEditLastSat = S;
            memcpy(g.ColorEditLastColor, col, sizeof(float) * 3);
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            col[0] = H;
            col[1] = S;
            col[2] = V;
        }
    }

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_DisplayRGB || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_DisplayRGB))
            {
                // FIXME: Hackily differentiating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_DisplayHSV || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_DisplayHSV);
        if (flags & ImGuiColorEditFlags_DisplayHex || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_DisplayHex);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap && (flags & ImGuiColorEditFlags_InputRGB))
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    if (value_changed)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            R = col[0];
            G = col[1];
            B = col[2];
            ColorConvertRGBtoHSV(R, G, B, H, S, V);
            if (memcmp(g.ColorEditLastColor, col, sizeof(float) * 3) == 0) // Fix local Hue as display below will use it immediately.
            {
                if (S == 0)
                    H = g.ColorEditLastHue;
                if (V == 0)
                    S = g.ColorEditLastSat;
            }
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            H = col[0];
            S = col[1];
            V = col[2];
            ColorConvertHSVtoRGB(H, S, V, R, G, B);
        }
    }

    const int style_alpha8 = IM_F32_TO_INT8_SAT(style.Alpha);
    const ImU32 col_black = IM_COL32(0,0,0,style_alpha8);
    const ImU32 col_white = IM_COL32(255,255,255,style_alpha8);
    const ImU32 col_midgrey = IM_COL32(128,128,128,style_alpha8);
    const ImU32 col_hues[6 + 1] = { IM_COL32(255,0,0,style_alpha8), IM_COL32(255,255,0,style_alpha8), IM_COL32(0,255,0,style_alpha8), IM_COL32(0,255,255,style_alpha8), IM_COL32(0,0,255,style_alpha8), IM_COL32(255,0,255,style_alpha8), IM_COL32(255,0,0,style_alpha8) };

    ImVec4 hue_color_f(1, 1, 1, style.Alpha); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 user_col32_striped_of_alpha = ColorConvertFloat4ToU32(ImVec4(R, G, B, style.Alpha)); // Important: this is still including the main rendering/style alpha!!

    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 0.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(col_white, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, col_hues[n], col_hues[n + 1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner + wheel_r_outer) * 0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner + wheel_r_outer) * 0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad + 1, col_midgrey, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, col_white, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, col_white);
        draw_list->PrimVtx(tra, uv_white, 0);
        draw_list->PrimVtx(trb, uv_white, col_black);
        draw_list->PrimVtx(trc, uv_white, 0);
        draw_list->AddTriangle(tra, trb, trc, col_midgrey, 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), col_white, hue_color32, hue_color32, col_white);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0, 0, col_black, col_black);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp(IM_ROUND(picker_pos.x + ImSaturate(S)     * sv_picker_size), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp(IM_ROUND(picker_pos.y + ImSaturate(1 - V) * sv_picker_size), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), col_hues[i], col_hues[i], col_hues[i + 1], col_hues[i + 1]);
        float bar0_line_y = IM_ROUND(picker_pos.y + H * sv_picker_size);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, user_col32_striped_of_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad + 1, col_midgrey, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, col_white, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(draw_list, bar1_bb.Min, bar1_bb.Max, 0, bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, user_col32_striped_of_alpha, user_col32_striped_of_alpha, user_col32_striped_of_alpha & ~IM_COL32_A_MASK, user_col32_striped_of_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = IM_ROUND(picker_pos.y + (1.0f - alpha) * sv_picker_size);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(window->DC.LastItemId);

    PopID();

    return value_changed;
}